

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,i64 *pnChange)

{
  uint uVar1;
  MemPage *pPage_00;
  int iVar2;
  uint *pCell;
  ulong uVar3;
  MemPage *pPage;
  CellInfo info;
  MemPage *local_60;
  int local_54;
  ulong local_50;
  CellInfo local_48;
  
  if (pBt->nPage < pgno) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13031,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
    return 0xb;
  }
  iVar2 = getAndInitPage(pBt,pgno,&local_60,(BtCursor *)0x0,0);
  pPage_00 = local_60;
  if (iVar2 != 0) {
    return iVar2;
  }
  if (((pBt->openFlags & 4) == 0) && ((pgno == 1) + 1 != (int)local_60->pDbPage->nRef)) {
    iVar2 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13038,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  }
  else {
    local_50 = (ulong)local_60->hdrOffset;
    iVar2 = 0;
    local_54 = freePageFlag;
    if (local_60->nCell != 0) {
      uVar3 = 0;
      do {
        pCell = (uint *)(pPage_00->aData +
                        (CONCAT11(pPage_00->aCellIdx[uVar3 * 2],pPage_00->aCellIdx[uVar3 * 2 + 1]) &
                        pPage_00->maskPage));
        if (pPage_00->leaf == '\0') {
          uVar1 = *pCell;
          iVar2 = clearDatabasePage(pBt,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                        (uVar1 & 0xff00) << 8 | uVar1 << 0x18,1,pnChange);
          if (iVar2 != 0) goto LAB_00165038;
        }
        (*pPage_00->xParseCell)(pPage_00,(u8 *)pCell,&local_48);
        iVar2 = 0;
        if (local_48.nPayload != local_48.nLocal) {
          iVar2 = clearCellOverflow(pPage_00,(uchar *)pCell,&local_48);
        }
        if (iVar2 != 0) goto LAB_00165038;
        uVar3 = uVar3 + 1;
      } while (uVar3 < pPage_00->nCell);
    }
    uVar3 = local_50;
    if (pPage_00->leaf == '\0') {
      uVar1 = *(uint *)(pPage_00->aData + local_50 + 8);
      iVar2 = clearDatabasePage(pBt,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                    | uVar1 << 0x18,1,pnChange);
      if (iVar2 != 0) goto LAB_00165038;
      if (pPage_00->intKey != '\0') {
        pnChange = (long *)0x0;
      }
    }
    if (pnChange != (long *)0x0) {
      *pnChange = *pnChange + (ulong)pPage_00->nCell;
    }
    if (local_54 == 0) {
      iVar2 = sqlite3PagerWrite(pPage_00->pDbPage);
      if (iVar2 == 0) {
        zeroPage(pPage_00,pPage_00->aData[uVar3] | 8);
      }
    }
    else if (iVar2 == 0) {
      iVar2 = freePage2(pPage_00->pBt,pPage_00,pPage_00->pgno);
    }
  }
LAB_00165038:
  if (local_60 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_60->pDbPage);
  }
  return iVar2;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  i64 *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;
  int hdr;
  CellInfo info;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }
  rc = getAndInitPage(pBt, pgno, &pPage, 0, 0);
  if( rc ) return rc;
  if( (pBt->openFlags & BTREE_SINGLE)==0
   && sqlite3PagerPageRefcount(pPage->pDbPage) != (1 + (pgno==1))
  ){
    rc = SQLITE_CORRUPT_BKPT;
    goto cleardatabasepage_out;
  }
  hdr = pPage->hdrOffset;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    BTREE_CLEAR_CELL(rc, pPage, pCell, info);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[hdr+8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
    if( pPage->intKey ) pnChange = 0;
  }
  if( pnChange ){
    testcase( !pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[hdr] | PTF_LEAF);
  }

cleardatabasepage_out:
  releasePage(pPage);
  return rc;
}